

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNErrCode format_convert(SUNMatrix A,SUNMatrix B)

{
  long *plVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  long *plVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  undefined8 uVar14;
  SUNErrCode SVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  undefined8 uVar21;
  
  pvVar3 = A->content;
  iVar2 = *(int *)((long)pvVar3 + 0x28);
  pvVar4 = B->content;
  if (iVar2 != *(int *)((long)pvVar4 + 0x28)) {
    plVar5 = *(long **)((long)pvVar3 + 0x38);
    lVar6 = *(long *)((long)pvVar3 + 0x20);
    lVar7 = *(long *)((long)pvVar3 + 0x30);
    uVar8 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 != 1) * 8);
    uVar9 = *(ulong *)((long)pvVar3 + (ulong)(iVar2 == 1) * 8);
    lVar10 = *(long *)((long)pvVar4 + 0x38);
    lVar11 = *(long *)((long)pvVar4 + 0x20);
    lVar12 = *(long *)((long)pvVar4 + 0x30);
    uVar18 = plVar5[uVar8];
    uVar16 = SUNMatZero_Sparse(B);
    uVar17 = (ulong)uVar16;
    if (0 < (long)uVar18) {
      uVar17 = 0;
      do {
        plVar1 = (long *)(lVar10 + *(long *)(lVar7 + uVar17 * 8) * 8);
        *plVar1 = *plVar1 + 1;
        uVar17 = uVar17 + 1;
      } while (uVar18 != uVar17);
    }
    if (0 < (long)uVar9) {
      uVar17 = 0;
      lVar19 = 0;
      do {
        lVar20 = *(long *)(lVar10 + uVar17 * 8);
        *(long *)(lVar10 + uVar17 * 8) = lVar19;
        uVar17 = uVar17 + 1;
        lVar19 = lVar20 + lVar19;
      } while (uVar9 != uVar17);
    }
    *(ulong *)(lVar10 + uVar9 * 8) = uVar18;
    if (0 < (long)uVar8) {
      lVar19 = *plVar5;
      uVar18 = 0;
      do {
        uVar17 = uVar18 + 1;
        lVar20 = lVar19;
        lVar19 = plVar5[uVar18 + 1];
        for (; lVar20 < lVar19; lVar20 = lVar20 + 1) {
          lVar19 = *(long *)(lVar7 + lVar20 * 8);
          lVar13 = *(long *)(lVar10 + lVar19 * 8);
          *(ulong *)(lVar12 + lVar13 * 8) = uVar18;
          *(undefined8 *)(lVar11 + lVar13 * 8) = *(undefined8 *)(lVar6 + lVar20 * 8);
          plVar1 = (long *)(lVar10 + lVar19 * 8);
          *plVar1 = *plVar1 + 1;
          lVar19 = plVar5[uVar17];
        }
        uVar18 = uVar17;
      } while (uVar17 != uVar8);
    }
    if (-1 < (long)uVar9) {
      uVar17 = 0;
      uVar21 = 0;
      do {
        uVar14 = *(undefined8 *)(lVar10 + uVar17 * 8);
        *(undefined8 *)(lVar10 + uVar17 * 8) = uVar21;
        uVar17 = uVar17 + 1;
        uVar21 = uVar14;
      } while (uVar9 + 1 != uVar17);
    }
    return (SUNErrCode)uVar17;
  }
  SVar15 = SUNMatCopy_Sparse(A,B);
  return SVar15;
}

Assistant:

SUNErrCode format_convert(const SUNMatrix A, SUNMatrix B)
{
  SUNFunctionBegin(A->sunctx);

  sunrealtype *Ax, *Bx;
  sunindextype *Ap, *Aj;
  sunindextype *Bp, *Bi;
  sunindextype n_row, n_col, nnz;
  sunindextype n, col, csum, row, last;

  if (SM_SPARSETYPE_S(A) == SM_SPARSETYPE_S(B))
  {
    SUNCheckCall(SUNMatCopy_Sparse(A, B));
    return SUN_SUCCESS;
  }

  Ap = SM_INDEXPTRS_S(A);
  SUNAssert(Ap, SUN_ERR_ARG_CORRUPT);
  Aj = SM_INDEXVALS_S(A);
  SUNAssert(Aj, SUN_ERR_ARG_CORRUPT);
  Ax = SM_DATA_S(A);
  SUNAssert(Ax, SUN_ERR_ARG_CORRUPT);

  n_row = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_ROWS_S(A) : SM_COLUMNS_S(A);
  n_col = (SM_SPARSETYPE_S(A) == CSR_MAT) ? SM_COLUMNS_S(A) : SM_ROWS_S(A);

  Bp = SM_INDEXPTRS_S(B);
  Bi = SM_INDEXVALS_S(B);
  Bx = SM_DATA_S(B);

  nnz = Ap[n_row];

  SUNCheckCall(SUNMatZero_Sparse(B));

  /* compute number of non-zero entries per column (if CSR) or per row (if CSC)
   * of A */
  for (n = 0; n < nnz; n++) { Bp[Aj[n]]++; }

  /* cumualtive sum the nnz per column to get Bp[] */
  for (col = 0, csum = 0; col < n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = csum;
    csum += temp;
  }
  Bp[n_col] = nnz;

  for (row = 0; row < n_row; row++)
  {
    sunindextype jj;
    for (jj = Ap[row]; jj < Ap[row + 1]; jj++)
    {
      col               = Aj[jj];
      sunindextype dest = Bp[col];

      Bi[dest] = row;
      Bx[dest] = Ax[jj];

      Bp[col]++;
    }
  }

  for (col = 0, last = 0; col <= n_col; col++)
  {
    sunindextype temp = Bp[col];
    Bp[col]           = last;
    last              = temp;
  }

  return SUN_SUCCESS;
}